

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

int lyv_data_unique(lyd_node *list)

{
  char **ppcVar1;
  byte bVar2;
  uint uVar3;
  ly_ctx *ctx;
  int iVar4;
  uint32_t uVar5;
  ly_set *set;
  ulong uVar6;
  hash_table *phVar7;
  lyd_node *plVar8;
  size_t len;
  char *pcVar9;
  char *pcVar10;
  void *pvVar11;
  lys_node *plVar12;
  char *pcVar13;
  undefined8 uStack_90;
  char *local_78;
  char *path;
  char *local_68;
  uint32_t local_5c;
  lys_node *local_58;
  hash_table *local_50;
  char *id;
  void *local_40;
  undefined8 local_38;
  
  if ((list->validity & 2) == 0) {
    return 0;
  }
  plVar12 = list->schema;
  ctx = plVar12->module->ctx;
  iVar4 = ly_vlog_build_path(LY_VLOG_LYD,list,&local_78,0,1);
  if (iVar4 != 0) {
    return -1;
  }
  set = lyd_find_path(list,local_78);
  free(local_78);
  if (set == (ly_set *)0x0) {
    return -1;
  }
  uVar3 = set->number;
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    ppcVar1 = &(set->set).s[uVar6]->dsc;
    *(byte *)ppcVar1 = *(byte *)ppcVar1 & 0xfd;
  }
  if (uVar3 == 2) {
    iVar4 = lyv_list_uniq_equal((set->set).s,(set->set).s + 1,2,(void *)0x0);
    if (iVar4 != 0) {
      ly_set_free(set);
      return 1;
    }
    local_38 = 0;
  }
  else if (uVar3 < 3) {
    local_38 = 0;
  }
  else {
    for (iVar4 = -1; iVar4 != -0x20; iVar4 = iVar4 + -1) {
      if (uVar3 <= 0xffffffffU >> ((char)iVar4 + 0x20U & 0x1f)) {
        bVar2 = plVar12->padding[3];
        local_40 = malloc((ulong)((uint)bVar2 * 8));
        if (local_40 != (void *)0x0) {
          pvVar11 = (void *)0x1;
          local_58 = plVar12;
          id = (char *)(ulong)bVar2;
          goto LAB_0011e094;
        }
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyv_data_unique");
        goto LAB_0011e110;
      }
    }
    ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
           ,0x123);
LAB_0011e110:
    local_38 = 0xffffffffffffffff;
  }
  pcVar9 = (char *)0x0;
  pvVar11 = (void *)0x0;
  goto LAB_0011e11a;
  while( true ) {
    phVar7 = lyht_new(1 << (-(char)iVar4 & 0x1fU),8,lyv_list_uniq_equal,pvVar11,0);
    *(hash_table **)((long)local_40 + (long)pvVar11 * 8 + -8) = phVar7;
    pvVar11 = (void *)((long)pvVar11 + 1);
    if (phVar7 == (hash_table *)0x0) break;
LAB_0011e094:
    if ((long)pvVar11 - (long)(ulong)bVar2 == 1) {
      local_38 = 0;
      pcVar10 = (char *)0x0;
      pcVar9 = id;
      plVar12 = local_58;
      while (pvVar11 = local_40, pcVar10 < (char *)(ulong)set->number) {
        pcVar13 = (char *)0x0;
        path = pcVar10;
        while (pcVar13 != pcVar9) {
          local_50 = (hash_table *)0x0;
          uVar5 = 0;
          local_68 = pcVar13;
          for (uVar6 = 0; pcVar9 = path, uVar6 < *(byte *)(plVar12[1].ext + (long)pcVar13 * 2 + 1);
              uVar6 = uVar6 + 1) {
            local_5c = uVar5;
            plVar8 = resolve_data_descendant_schema_nodeid
                               ((char *)(&plVar12[1].ext[(long)pcVar13 * 2]->def)[uVar6],
                                (lyd_node *)(set->set).s[(long)path]->parent);
            if (plVar8 == (lyd_node *)0x0) {
              iVar4 = lyd_get_unique_default
                                ((char *)(&plVar12[1].ext[(long)pcVar13 * 2]->def)[uVar6],
                                 (lyd_node *)(set->set).s[(long)pcVar9],(char **)&local_50);
              if (iVar4 != 0) {
                uStack_90 = 0xffffffffffffffff;
                pcVar9 = id;
                pvVar11 = local_40;
                local_38 = uStack_90;
                goto LAB_0011e11a;
              }
            }
            else {
              local_50 = plVar8->ht;
            }
            phVar7 = local_50;
            uVar5 = local_5c;
            if (local_50 == (hash_table *)0x0) goto LAB_0011e285;
            len = strlen((char *)local_50);
            uVar5 = dict_hash_multi(uVar5,(char *)phVar7,len);
            plVar12 = local_58;
          }
          if (local_50 != (hash_table *)0x0) {
            uVar5 = dict_hash_multi(uVar5,(char *)0x0,0);
            iVar4 = lyht_insert(*(hash_table **)((long)local_40 + (long)local_68 * 8),
                                (set->set).s + (long)pcVar10,uVar5,(void **)0x0);
            if (iVar4 != 0) {
              uStack_90 = 1;
              pcVar9 = id;
              pvVar11 = local_40;
              local_38 = uStack_90;
              goto LAB_0011e11a;
            }
          }
LAB_0011e285:
          pcVar9 = id;
          plVar12 = local_58;
          pcVar13 = local_68 + 1;
        }
        pcVar10 = path + 1;
      }
      goto LAB_0011e11a;
    }
  }
  ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyv_data_unique");
  local_38 = 0xffffffffffffffff;
  pcVar9 = id;
  pvVar11 = local_40;
LAB_0011e11a:
  ly_set_free(set);
  for (uVar6 = 0;
      (((ulong)pcVar9 & 0xff) != uVar6 &&
      (phVar7 = *(hash_table **)((long)pvVar11 + uVar6 * 8), phVar7 != (hash_table *)0x0));
      uVar6 = uVar6 + 1) {
    lyht_free(phVar7);
  }
  free(pvVar11);
  return (int)local_38;
}

Assistant:

int
lyv_data_unique(struct lyd_node *list)
{
    struct lyd_node *diter;
    struct ly_set *set;
    uint32_t i, j, n = 0;
    int ret = 0;
    uint32_t hash, u, usize = 0;
    struct hash_table **uniqtables = NULL;
    const char *id;
    char *path;
    struct lys_node_list *slist;
    struct ly_ctx *ctx = list->schema->module->ctx;

    if (!(list->validity & LYD_VAL_UNIQUE)) {
        /* validated sa part of another instance validation */
        return 0;
    }

    slist = (struct lys_node_list *)list->schema;

    /* get all list instances */
    if (ly_vlog_build_path(LY_VLOG_LYD, list, &path, 0, 1)) {
        return -1;
    }
    set = lyd_find_path(list, path);
    free(path);
    if (!set) {
        return -1;
    }

    for (i = 0; i < set->number; ++i) {
        /* remove the flag */
        set->set.d[i]->validity &= ~LYD_VAL_UNIQUE;
    }

    if (set->number == 2) {
        /* simple comparison */
        if (lyv_list_uniq_equal(&set->set.d[0], &set->set.d[1], 0, (void *)0)) {
            /* instance duplication */
            ly_set_free(set);
            return 1;
        }
    } else if (set->number > 2) {
        /* use hashes for comparison */
        /* first, allocate the table, the size depends on number of items in the set */
        for (u = 31; u > 0; u--) {
            usize = set->number << u;
            usize = usize >> u;
            if (usize == set->number) {
                break;
            }
        }
        if (u == 0) {
            LOGINT(ctx);
            ret = -1;
            goto cleanup;
        } else {
            u = 32 - u;
            usize = 1 << u;
        }

        n = slist->unique_size;
        uniqtables = malloc(n * sizeof *uniqtables);
        if (!uniqtables) {
            LOGMEM(ctx);
            ret = -1;
            n = 0;
            goto cleanup;
        }
        for (j = 0; j < n; j++) {
            uniqtables[j] = lyht_new(usize, sizeof(struct lyd_node *), lyv_list_uniq_equal, (void *)(j + 1L), 0);
            if (!uniqtables[j]) {
                LOGMEM(ctx);
                ret = -1;
                goto cleanup;
            }
        }

        for (u = 0; u < set->number; u++) {
            /* loop for unique - get the hash for the instances */
            for (j = 0; j < n; j++) {
                id = NULL;
                for (i = hash = 0; i < slist->unique[j].expr_size; i++) {
                    diter = resolve_data_descendant_schema_nodeid(slist->unique[j].expr[i], set->set.d[u]->child);
                    if (diter) {
                        id = ((struct lyd_node_leaf_list *)diter)->value_str;
                    } else {
                        /* use default value */
                        if (lyd_get_unique_default(slist->unique[j].expr[i], set->set.d[u], &id)) {
                            ret = -1;
                            goto cleanup;
                        }
                    }
                    if (!id) {
                        /* unique item not present nor has default value */
                        break;
                    }
                    hash = dict_hash_multi(hash, id, strlen(id));
                }
                if (!id) {
                    /* skip this list instance since its unique set is incomplete */
                    continue;
                }

                /* finish the hash value */
                hash = dict_hash_multi(hash, NULL, 0);

                /* insert into the hashtable */
                if (lyht_insert(uniqtables[j], &set->set.d[u], hash, NULL)) {
                    ret = 1;
                    goto cleanup;
                }
            }
        }
    }

cleanup:
    ly_set_free(set);
    for (j = 0; j < n; j++) {
        if (!uniqtables[j]) {
            /* failed when allocating uniquetables[j], following j are not allocated */
            break;
        }
        lyht_free(uniqtables[j]);
    }
    free(uniqtables);

    return ret;
}